

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5DataDelete(Fts5Index *p,i64 iFirst,i64 iLast)

{
  int iVar1;
  char *zSql;
  sqlite3_stmt *pStmt;
  
  if (p->rc != 0) {
    return;
  }
  pStmt = p->pDeleter;
  if (pStmt == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("DELETE FROM \'%q\'.\'%q_data\' WHERE id>=? AND id<=?",p->pConfig->zDb,
                           p->pConfig->zName);
    iVar1 = fts5IndexPrepareStmt(p,&p->pDeleter,zSql);
    if (iVar1 != 0) {
      return;
    }
    pStmt = p->pDeleter;
  }
  sqlite3_bind_int64(pStmt,1,iFirst);
  sqlite3_bind_int64(p->pDeleter,2,iLast);
  sqlite3_step(p->pDeleter);
  iVar1 = sqlite3_reset(p->pDeleter);
  p->rc = iVar1;
  return;
}

Assistant:

static void fts5DataDelete(Fts5Index *p, i64 iFirst, i64 iLast){
  if( p->rc!=SQLITE_OK ) return;

  if( p->pDeleter==0 ){
    Fts5Config *pConfig = p->pConfig;
    char *zSql = sqlite3_mprintf(
        "DELETE FROM '%q'.'%q_data' WHERE id>=? AND id<=?", 
          pConfig->zDb, pConfig->zName
    );
    if( fts5IndexPrepareStmt(p, &p->pDeleter, zSql) ) return;
  }

  sqlite3_bind_int64(p->pDeleter, 1, iFirst);
  sqlite3_bind_int64(p->pDeleter, 2, iLast);
  sqlite3_step(p->pDeleter);
  p->rc = sqlite3_reset(p->pDeleter);
}